

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall Bracket::Bracket(Bracket *this,string *str,unsigned_long *pos)

{
  bool bVar1;
  char *pcVar2;
  Bracket *this_00;
  Symbol *this_01;
  string local_88;
  Symbol *local_68;
  Bracket *local_60 [2];
  Atom *temp;
  string local_40;
  unsigned_long *local_20;
  unsigned_long *pos_local;
  string *str_local;
  Bracket *this_local;
  
  local_20 = pos;
  pos_local = (unsigned_long *)str;
  str_local = (string *)this;
  Atom::Atom(&this->super_Atom);
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00112c00;
  std::__cxx11::string::string((string *)&this->func);
  std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::list(&this->para);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pos_local);
  if (*pcVar2 != '(') {
    __assert_fail("str[pos] == \'(\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Atom.cpp"
                  ,0x21,"Bracket::Bracket(const std::string &, unsigned long &)");
  }
  *local_20 = *local_20 + 1;
  getWord(&local_40,(string *)pos_local,local_20);
  std::__cxx11::string::operator=((string *)&this->func,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pos_local), *pcVar2 != ')') {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pos_local);
    bVar1 = isBlank(pcVar2);
    if (bVar1) {
      *local_20 = *local_20 + 1;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pos_local);
      if (*pcVar2 == '(') {
        this_00 = (Bracket *)operator_new(0x40);
        Bracket(this_00,(string *)pos_local,local_20);
        local_60[0] = this_00;
        std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back
                  (&this->para,(value_type *)local_60);
        *local_20 = *local_20 + 1;
      }
      else {
        this_01 = (Symbol *)operator_new(0x28);
        getWord(&local_88,(string *)pos_local,local_20);
        Symbol::Symbol(this_01,&local_88);
        local_68 = this_01;
        std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back
                  (&this->para,(value_type *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  return;
}

Assistant:

Bracket::Bracket(const std::string &str, unsigned long &pos) {
    assert(str[pos] == '(');
    pos++;
    func = getWord(str, pos);
    Atom *temp;
    while (str[pos] != ')') {
        if (isBlank(str[pos])) {
            pos++;
        } else if (str[pos] == '(') {
            para.push_back(new Bracket(str, pos));
            pos++;
        } else {
            para.push_back(new Symbol(getWord(str, pos)));
        }
    }
}